

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O3

bool __thiscall flatbuffers::jsons::JsonSchemaGenerator::generate(JsonSchemaGenerator *this)

{
  BaseType BVar1;
  FieldDef *pFVar2;
  EnumDef *pEVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer ppEVar7;
  Parser *pPVar8;
  EnumVal *pEVar9;
  size_type *psVar10;
  ulong *puVar11;
  BaseType extraout_EDX;
  BaseType extraout_EDX_00;
  BaseType extraout_EDX_01;
  BaseType extraout_EDX_02;
  BaseType extraout_EDX_03;
  BaseType BVar12;
  pointer ppEVar13;
  string *psVar14;
  _Alloc_hider _Var15;
  pointer ppEVar16;
  pointer ppFVar17;
  int iVar18;
  char *pcVar19;
  ulong uVar20;
  undefined8 uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  StructDef *pSVar23;
  char *pcVar24;
  bool bVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enumdef;
  string comment;
  string arrayInfo;
  string typeLine;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> requiredProperties;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  string local_1f8;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  string local_1b8;
  string local_190;
  string *local_170;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  pointer local_128;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  StructDef *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  string local_98;
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  StructDef *local_38;
  
  psVar14 = &this->code_;
  pcVar24 = "";
  std::__cxx11::string::_M_replace((ulong)psVar14,0,(char *)(this->code_)._M_string_length,0x36bc82)
  ;
  pPVar8 = (this->super_BaseGenerator).parser_;
  pSVar23 = pPVar8->root_struct_def_;
  if (pSVar23 == (StructDef *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: Binary schema not generated, no root struct found\n",
               0x39);
    goto LAB_002d55b1;
  }
  bVar25 = -1 < (pPVar8->opts).indent_step;
  pcVar19 = "";
  if (bVar25) {
    pcVar19 = "\n";
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,pcVar19,pcVar19 + bVar25);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x373307);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258.field_2._8_8_ = plVar5[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_258._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_170 = psVar14;
  std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
  iVar18 = 0;
  if (0 < iVar4) {
    iVar18 = iVar4;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar18);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
  paVar22 = &local_278.field_2;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_278.field_2._M_allocated_capacity = *puVar11;
    local_278.field_2._8_8_ = plVar5[3];
    local_278._M_dataplus._M_p = (pointer)paVar22;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar11;
    local_278._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_278._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  pcVar19 = "";
  if (bVar25) {
    pcVar19 = "\n";
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar19,pcVar19 + bVar25);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar22) {
    uVar21 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_218._M_string_length + local_278._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar21 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_218._M_string_length + local_278._M_string_length) goto LAB_002d104a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_218,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_002d104a:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258.field_2._8_8_ = puVar6[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_258._M_string_length = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  std::__cxx11::string::_M_append((char *)local_170,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar22) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
  iVar18 = 0;
  if (0 < iVar4) {
    iVar18 = iVar4;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar18);
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
  paVar22 = &local_278.field_2;
  puVar11 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_278.field_2._M_allocated_capacity = *puVar11;
    local_278.field_2._8_8_ = puVar6[3];
    local_278._M_dataplus._M_p = (pointer)paVar22;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar11;
    local_278._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_278._M_string_length = puVar6[1];
  *puVar6 = puVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  if (bVar25) {
    pcVar24 = "\n";
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar24,pcVar24 + bVar25);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar22) {
    uVar21 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_218._M_string_length + local_278._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar21 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_218._M_string_length + local_278._M_string_length) goto LAB_002d1220;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_218,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_002d1220:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258.field_2._8_8_ = puVar6[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_258._M_string_length = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  std::__cxx11::string::_M_append((char *)local_170,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar22) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  psVar14 = local_170;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pPVar8 = (this->super_BaseGenerator).parser_;
  ppEVar16 = (pPVar8->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_38 = pSVar23;
  if (ppEVar16 !=
      (pPVar8->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar4 = (pPVar8->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)iVar4 * '\x02');
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      puVar11 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_218.field_2._M_allocated_capacity = *puVar11;
        local_218.field_2._8_8_ = plVar5[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *puVar11;
        local_218._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_218._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      anon_unknown_1::GenFullName<flatbuffers::EnumDef>(&local_1b8,*ppEVar16);
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar21 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1b8._M_string_length + local_218._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          uVar21 = local_1b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1b8._M_string_length + local_218._M_string_length)
        goto LAB_002d1423;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002d1423:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1b8._M_dataplus._M_p);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_238.field_2._M_allocated_capacity = *psVar10;
        local_238.field_2._8_8_ = puVar6[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar10;
        local_238._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_238._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar11 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = plVar5[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar24,pcVar24 + bVar25)
      ;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        uVar21 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1d0 + local_278._M_string_length) {
        uVar20 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar20 = local_1c8;
        }
        if (uVar20 < local_1d0 + local_278._M_string_length) goto LAB_002d1572;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d1572:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_218,(char)iVar4 * '\x03');
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"string","");
      anon_unknown_1::GenType(&local_1f8,&local_1b8);
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar21 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1f8._M_string_length + local_218._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar21 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1f8._M_string_length + local_218._M_string_length)
        goto LAB_002d1789;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002d1789:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_238.field_2._M_allocated_capacity = *psVar10;
        local_238.field_2._8_8_ = puVar6[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar10;
        local_238._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_238._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar11 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = plVar5[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar24,pcVar24 + bVar25)
      ;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        uVar21 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1d0 + local_278._M_string_length) {
        uVar20 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar20 = local_1c8;
        }
        if (uVar20 < local_1d0 + local_278._M_string_length) goto LAB_002d18d8;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d18d8:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_278,(char)iVar4 * '\x03');
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      ppEVar13 = ((*ppEVar16)->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppEVar13 !=
          ((*ppEVar16)->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::operator+(&local_238,"\"",&(*ppEVar13)->name);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          puVar11 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_278.field_2._M_allocated_capacity = *puVar11;
            local_278.field_2._8_8_ = plVar5[3];
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar11;
            local_278._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_278._M_string_length = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          ppEVar7 = ((*ppEVar16)->vals).vec.
                    super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (*ppEVar13 != ppEVar7[-1]) {
            std::__cxx11::string::append((char *)&local_258);
            ppEVar7 = ((*ppEVar16)->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          ppEVar13 = ppEVar13 + 1;
        } while (ppEVar13 != ppEVar7);
      }
      std::__cxx11::string::append((char *)&local_258);
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,pcVar24,pcVar24 + bVar25)
      ;
      psVar14 = local_170;
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_238,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p)
      ;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_278.field_2._M_allocated_capacity = *psVar10;
        local_278.field_2._8_8_ = plVar5[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar10;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_218,(char)iVar4 * '\x02');
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      puVar11 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_238.field_2._M_allocated_capacity = *puVar11;
        local_238.field_2._8_8_ = plVar5[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *puVar11;
        local_238._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_238._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar24,pcVar24 + bVar25)
      ;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        uVar21 = local_238.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1f8._M_string_length + local_238._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar21 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1f8._M_string_length + local_238._M_string_length)
        goto LAB_002d1dd8;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
      }
      else {
LAB_002d1dd8:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_238,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar11 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = puVar6[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_278._M_string_length = puVar6[1];
      *puVar6 = puVar11;
      puVar6[1] = 0;
      *(undefined1 *)puVar11 = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      ppEVar16 = ppEVar16 + 1;
      pPVar8 = (this->super_BaseGenerator).parser_;
    } while (ppEVar16 !=
             (pPVar8->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_128 = (pPVar8->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (local_128 !=
      (pPVar8->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      paVar22 = &local_278.field_2;
      iVar4 = (pPVar8->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)iVar4 * '\x02');
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      puVar11 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_218.field_2._M_allocated_capacity = *puVar11;
        local_218.field_2._8_8_ = plVar5[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *puVar11;
        local_218._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_218._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      anon_unknown_1::GenFullName<flatbuffers::StructDef>(&local_1b8,*local_128);
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar21 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1b8._M_string_length + local_218._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          uVar21 = local_1b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1b8._M_string_length + local_218._M_string_length)
        goto LAB_002d201c;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002d201c:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1b8._M_dataplus._M_p);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_238.field_2._M_allocated_capacity = *psVar10;
        local_238.field_2._8_8_ = puVar6[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar10;
        local_238._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_238._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
      puVar11 = (ulong *)(plVar5 + 2);
      local_1d8 = &local_1c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = plVar5[3];
        local_278._M_dataplus._M_p = (pointer)paVar22;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar24,pcVar24 + bVar25)
      ;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        uVar21 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1d0 + local_278._M_string_length) {
        uVar20 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar20 = local_1c8;
        }
        if (uVar20 < local_1d0 + local_278._M_string_length) goto LAB_002d215a;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d215a:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_218,(char)iVar4 * '\x03');
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"object","");
      anon_unknown_1::GenType(&local_1f8,&local_1b8);
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar21 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1f8._M_string_length + local_218._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar21 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1f8._M_string_length + local_218._M_string_length)
        goto LAB_002d236c;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_002d236c:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_218,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      puVar11 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_238.field_2._M_allocated_capacity = *puVar11;
        local_238.field_2._8_8_ = puVar6[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *puVar11;
        local_238._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_238._M_string_length = puVar6[1];
      *puVar6 = puVar11;
      puVar6[1] = 0;
      *(undefined1 *)puVar11 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
      puVar11 = (ulong *)(plVar5 + 2);
      local_1d8 = &local_1c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = plVar5[3];
        local_278._M_dataplus._M_p = (pointer)paVar22;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar24,pcVar24 + bVar25)
      ;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        uVar21 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1d0 + local_278._M_string_length) {
        uVar20 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar20 = local_1c8;
        }
        if (uVar20 < local_1d0 + local_278._M_string_length) goto LAB_002d24b2;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d24b2:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,local_1c8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      PrepareDescription(&local_218,this,&((*local_128)->super_Definition).doc_comment);
      pcVar24 = "";
      iVar4 = std::__cxx11::string::compare((char *)&local_218);
      if (iVar4 != 0) {
        iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)iVar4 * '\x03');
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        puVar11 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_1f8.field_2._M_allocated_capacity = *puVar11;
          local_1f8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1f8.field_2._M_allocated_capacity = *puVar11;
          local_1f8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1f8._M_string_length = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        puVar11 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_238.field_2._M_allocated_capacity = *puVar11;
          local_238.field_2._8_8_ = plVar5[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar11;
          local_238._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_238._M_string_length = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
        puVar11 = (ulong *)(plVar5 + 2);
        local_1d8 = &local_1c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_278.field_2._M_allocated_capacity = *puVar11;
          local_278.field_2._8_8_ = plVar5[3];
          local_278._M_dataplus._M_p = (pointer)paVar22;
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar11;
          local_278._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_278._M_string_length = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        pcVar19 = "";
        if (bVar25) {
          pcVar19 = "\n";
        }
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,pcVar19,pcVar19 + bVar25);
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          uVar21 = local_278.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1d0 + local_278._M_string_length) {
          uVar20 = 0xf;
          if (local_1d8 != &local_1c8) {
            uVar20 = local_1c8;
          }
          if (uVar20 < local_1d0 + local_278._M_string_length) goto LAB_002d2807;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
        }
        else {
LAB_002d2807:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
        }
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar10 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258.field_2._8_8_ = puVar6[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_258._M_string_length = puVar6[1];
        *puVar6 = psVar10;
        puVar6[1] = 0;
        *(undefined1 *)psVar10 = 0;
        std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
      }
      iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar4 * '\x03');
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
      puVar11 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = puVar6[3];
        local_278._M_dataplus._M_p = (pointer)paVar22;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_278._M_string_length = puVar6[1];
      *puVar6 = puVar11;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (bVar25) {
        pcVar24 = "\n";
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar24,pcVar24 + bVar25)
      ;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        uVar21 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1f8._M_string_length + local_278._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar21 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1f8._M_string_length + local_278._M_string_length)
        goto LAB_002d2a48;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d2a48:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_278,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      puVar11 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_258.field_2._M_allocated_capacity = *puVar11;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar11;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = puVar11;
      puVar6[1] = 0;
      *(undefined1 *)puVar11 = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_100 = *local_128;
      for (ppFVar17 = (local_100->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; paVar22 = &local_278.field_2,
          ppFVar17 !=
          (local_100->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar17 = ppFVar17 + 1) {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        if (((*ppFVar17)->value).type.base_type == BASE_TYPE_ARRAY) {
          bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
          pcVar24 = "";
          if (bVar25) {
            pcVar24 = "\n";
          }
          local_58[0] = local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,pcVar24,pcVar24 + bVar25);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x35eb60);
          local_148 = &local_138;
          puVar11 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar11) {
            local_138 = *puVar11;
            lStack_130 = plVar5[3];
          }
          else {
            local_138 = *puVar11;
            local_148 = (ulong *)*plVar5;
          }
          local_140 = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct((ulong)&local_b8,(char)(iVar4 << 3));
          uVar20 = 0xf;
          if (local_148 != &local_138) {
            uVar20 = local_138;
          }
          if (uVar20 < (ulong)(local_b0 + local_140)) {
            uVar20 = 0xf;
            if (local_b8 != local_a8) {
              uVar20 = local_a8[0];
            }
            if (uVar20 < (ulong)(local_b0 + local_140)) goto LAB_002d2cd3;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_148);
          }
          else {
LAB_002d2cd3:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_b8);
          }
          local_120 = &local_110;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_110 = *plVar5;
            uStack_108 = puVar6[3];
          }
          else {
            local_110 = *plVar5;
            local_120 = (long *)*puVar6;
          }
          local_118 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)plVar5 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
          local_168 = &local_158;
          puVar11 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar11) {
            local_158 = *puVar11;
            lStack_150 = plVar5[3];
          }
          else {
            local_158 = *puVar11;
            local_168 = (ulong *)*plVar5;
          }
          local_160 = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          NumToString<unsigned_short>(&local_78,((*ppFVar17)->value).type.fixed_length);
          uVar20 = 0xf;
          if (local_168 != &local_158) {
            uVar20 = local_158;
          }
          if (uVar20 < local_78._M_string_length + local_160) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              uVar21 = local_78.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_78._M_string_length + local_160) goto LAB_002d2e2d;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_168);
          }
          else {
LAB_002d2e2d:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_168,(ulong)local_78._M_dataplus._M_p);
          }
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_190.field_2._M_allocated_capacity = *puVar11;
            local_190.field_2._8_8_ = puVar6[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar11;
            local_190._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_190._M_string_length = puVar6[1];
          *puVar6 = puVar11;
          puVar6[1] = 0;
          *(undefined1 *)puVar11 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
          local_1d8 = &local_1c8;
          puVar11 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar11) {
            local_1c8 = *puVar11;
            lStack_1c0 = plVar5[3];
          }
          else {
            local_1c8 = *puVar11;
            local_1d8 = (ulong *)*plVar5;
          }
          local_1d0 = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
          pcVar24 = "";
          if (bVar25) {
            pcVar24 = "\n";
          }
          local_d8 = local_c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,pcVar24,pcVar24 + bVar25);
          uVar20 = 0xf;
          if (local_1d8 != &local_1c8) {
            uVar20 = local_1c8;
          }
          if (uVar20 < (ulong)(local_d0 + local_1d0)) {
            uVar20 = 0xf;
            if (local_d8 != local_c8) {
              uVar20 = local_c8[0];
            }
            if (uVar20 < (ulong)(local_d0 + local_1d0)) goto LAB_002d2faa;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_1d8);
          }
          else {
LAB_002d2faa:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_d8);
          }
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          puVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_1b8.field_2._M_allocated_capacity = *puVar11;
            local_1b8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *puVar11;
            local_1b8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_1b8._M_string_length = puVar6[1];
          *puVar6 = puVar11;
          puVar6[1] = 0;
          *(undefined1 *)puVar11 = 0;
          iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          local_f8 = local_e8;
          std::__cxx11::string::_M_construct((ulong)&local_f8,(char)(iVar4 << 3));
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            uVar21 = local_1b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_f0 + local_1b8._M_string_length) {
            uVar20 = 0xf;
            if (local_f8 != local_e8) {
              uVar20 = local_e8[0];
            }
            if (uVar20 < local_f0 + local_1b8._M_string_length) goto LAB_002d30bc;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_f8,0,(char *)0x0,(ulong)local_1b8._M_dataplus._M_p);
          }
          else {
LAB_002d30bc:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_f8);
          }
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_238.field_2._M_allocated_capacity = *puVar11;
            local_238.field_2._8_8_ = puVar6[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar11;
            local_238._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_238._M_string_length = puVar6[1];
          *puVar6 = puVar11;
          puVar6[1] = 0;
          *(undefined1 *)puVar11 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
          puVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_278.field_2._M_allocated_capacity = *puVar11;
            local_278.field_2._8_8_ = puVar6[3];
            local_278._M_dataplus._M_p = (pointer)paVar22;
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar11;
            local_278._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_278._M_string_length = puVar6[1];
          *puVar6 = puVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          NumToString<unsigned_short>(&local_98,((*ppFVar17)->value).type.fixed_length);
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar22) {
            uVar21 = local_278.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_98._M_string_length + local_278._M_string_length) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              uVar21 = local_98.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_98._M_string_length + local_278._M_string_length)
            goto LAB_002d31de;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_98,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
          }
          else {
LAB_002d31de:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_278,(ulong)local_98._M_dataplus._M_p);
          }
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          puVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_258.field_2._M_allocated_capacity = *puVar11;
            local_258.field_2._8_8_ = puVar6[3];
          }
          else {
            local_258.field_2._M_allocated_capacity = *puVar11;
            local_258._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_258._M_string_length = puVar6[1];
          *puVar6 = puVar11;
          puVar6[1] = 0;
          *(undefined1 *)puVar11 = 0;
          std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar22) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_f8 != local_e8) {
            operator_delete(local_f8,local_e8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if (local_d8 != local_c8) {
            operator_delete(local_d8,local_c8[0] + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
        }
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"");
        if ((*ppFVar17)->deprecated == true) {
          bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
          pcVar24 = "";
          if (bVar25) {
            pcVar24 = "\n";
          }
          local_1d8 = &local_1c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,pcVar24,pcVar24 + bVar25);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x35eb60);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar11 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_238.field_2._M_allocated_capacity = *puVar11;
            local_238.field_2._8_8_ = plVar5[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar11;
            local_238._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_238._M_string_length = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_190,(char)(iVar4 << 3));
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            uVar21 = local_238.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_190._M_string_length + local_238._M_string_length) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              uVar21 = local_190.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_190._M_string_length + local_238._M_string_length)
            goto LAB_002d35c1;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_190,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
          }
          else {
LAB_002d35c1:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_238,(ulong)local_190._M_dataplus._M_p);
          }
          puVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_278.field_2._M_allocated_capacity = *puVar11;
            local_278.field_2._8_8_ = puVar6[3];
            local_278._M_dataplus._M_p = (pointer)paVar22;
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar11;
            local_278._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_278._M_string_length = puVar6[1];
          *puVar6 = puVar11;
          puVar6[1] = 0;
          *(undefined1 *)puVar11 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          puVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_258.field_2._M_allocated_capacity = *puVar11;
            local_258.field_2._8_8_ = puVar6[3];
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          }
          else {
            local_258.field_2._M_allocated_capacity = *puVar11;
            local_258._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_258._M_string_length = puVar6[1];
          *puVar6 = puVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          psVar14 = local_170;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar22) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
        }
        iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_238,(char)(iVar4 << 2));
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_278.field_2._M_allocated_capacity = *psVar10;
          local_278.field_2._8_8_ = plVar5[3];
          local_278._M_dataplus._M_p = (pointer)paVar22;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar10;
          local_278._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_278._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_278,
                                    (ulong)((*ppFVar17)->super_Definition).name._M_dataplus._M_p);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258.field_2._8_8_ = plVar5[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_258._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
        local_1d8 = &local_1c8;
        puVar11 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar11) {
          local_1c8 = *puVar11;
          lStack_1c0 = plVar5[3];
        }
        else {
          local_1c8 = *puVar11;
          local_1d8 = (ulong *)*plVar5;
        }
        local_1d0 = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        pcVar24 = "";
        if (bVar25) {
          pcVar24 = "\n";
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,pcVar24,pcVar24 + bVar25);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x3794d0);
        puVar11 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_278.field_2._M_allocated_capacity = *puVar11;
          local_278.field_2._8_8_ = plVar5[3];
          local_278._M_dataplus._M_p = (pointer)paVar22;
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar11;
          local_278._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_278._M_string_length = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_190,(char)(iVar4 << 3));
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          uVar21 = local_278.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_190._M_string_length + local_278._M_string_length) {
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            uVar21 = local_190.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_190._M_string_length + local_278._M_string_length)
          goto LAB_002d39cb;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_190,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
        }
        else {
LAB_002d39cb:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_278,(ulong)local_190._M_dataplus._M_p);
        }
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        puVar11 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_258.field_2._M_allocated_capacity = *puVar11;
          local_258.field_2._8_8_ = puVar6[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *puVar11;
          local_258._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_258._M_string_length = puVar6[1];
        *puVar6 = puVar11;
        puVar6[1] = 0;
        *(undefined1 *)puVar11 = 0;
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_258._M_dataplus._M_p);
        BVar12 = extraout_EDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          BVar12 = extraout_EDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          BVar12 = extraout_EDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          BVar12 = extraout_EDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          BVar12 = extraout_EDX_03;
        }
        pFVar2 = *ppFVar17;
        BVar1 = (pFVar2->value).type.base_type;
        switch(BVar1) {
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_ARRAY:
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          local_258._M_string_length = 0;
          local_258.field_2._M_allocated_capacity =
               local_258.field_2._M_allocated_capacity & 0xffffffffffffff00;
          pSVar23 = (pFVar2->value).type.struct_def;
          if (pSVar23 == (StructDef *)0x0) {
            pEVar3 = (pFVar2->value).type.enum_def;
            if (pEVar3 == (EnumDef *)0x0) {
              (anonymous_namespace)::GenType_abi_cxx11_
                        (&local_278,(_anonymous_namespace_ *)(ulong)(pFVar2->value).type.element,
                         BVar12);
              goto LAB_002d3b12;
            }
            anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>(&local_278,pEVar3);
            std::__cxx11::string::operator=((string *)&local_258,(string *)&local_278);
          }
          else {
            anon_unknown_1::GenTypeRef<flatbuffers::StructDef>(&local_278,pSVar23);
LAB_002d3b12:
            std::__cxx11::string::operator=((string *)&local_258,(string *)&local_278);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar22) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_278,"\"type\" : \"array\", \"items\" : {",&local_258);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar11 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_190.field_2._M_allocated_capacity = *puVar11;
            local_190.field_2._8_8_ = plVar5[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar11;
            local_190._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_190._M_string_length = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar22) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          break;
        case BASE_TYPE_STRUCT:
          anon_unknown_1::GenTypeRef<flatbuffers::StructDef>
                    (&local_190,(pFVar2->value).type.struct_def);
          break;
        case BASE_TYPE_UNION:
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          local_190.field_2._M_allocated_capacity = 0x3a22664f796e6122;
          local_190._M_string_length = 10;
          local_190.field_2._8_3_ = 0x5b20;
          pEVar3 = (pFVar2->value).type.enum_def;
          for (ppEVar13 = (pEVar3->vals).vec.
                          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppEVar13 <
              (pEVar3->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish; ppEVar13 = ppEVar13 + 1) {
            pEVar9 = *ppEVar13;
            BVar12 = (pEVar9->union_type).base_type;
            if (BVar12 != BASE_TYPE_NONE) {
              if (BVar12 == BASE_TYPE_STRUCT) {
                anon_unknown_1::GenTypeRef<flatbuffers::StructDef>
                          (&local_238,(pEVar9->union_type).struct_def);
                plVar5 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_238,0,(char *)0x0,0x36a079);
                local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                puVar11 = (ulong *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar11) {
                  local_278.field_2._M_allocated_capacity = *puVar11;
                  local_278.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_278.field_2._M_allocated_capacity = *puVar11;
                  local_278._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_278._M_string_length = plVar5[1];
                *plVar5 = (long)puVar11;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                puVar11 = puVar6 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar11) {
                  local_258.field_2._M_allocated_capacity = *puVar11;
                  local_258.field_2._8_8_ = puVar6[3];
                }
                else {
                  local_258.field_2._M_allocated_capacity = *puVar11;
                  local_258._M_dataplus._M_p = (pointer)*puVar6;
                }
                local_258._M_string_length = puVar6[1];
                *puVar6 = puVar11;
                puVar6[1] = 0;
                *(undefined1 *)(puVar6 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_190,(ulong)local_258._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) {
                  operator_delete(local_258._M_dataplus._M_p,
                                  local_258.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_dataplus._M_p != &local_278.field_2) {
                  operator_delete(local_278._M_dataplus._M_p,
                                  local_278.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != &local_238.field_2) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
                pEVar9 = *ppEVar13;
              }
              if (pEVar9 != (((pFVar2->value).type.enum_def)->vals).vec.
                            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]) {
                std::__cxx11::string::append((char *)&local_190);
              }
            }
          }
          std::__cxx11::string::append((char *)&local_190);
          psVar14 = local_170;
          break;
        default:
          if (BVar1 == BASE_TYPE_UTYPE) {
            anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>
                      (&local_190,(pFVar2->value).type.enum_def);
          }
          else {
            pSVar23 = (pFVar2->value).type.struct_def;
            if (pSVar23 == (StructDef *)0x0) {
              pEVar3 = (pFVar2->value).type.enum_def;
              if (pEVar3 == (EnumDef *)0x0) {
                (anonymous_namespace)::GenType_abi_cxx11_
                          (&local_190,(_anonymous_namespace_ *)(ulong)BVar1,BVar12);
              }
              else {
                anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>(&local_190,pEVar3);
              }
            }
            else {
              anon_unknown_1::GenTypeRef<flatbuffers::StructDef>(&local_190,pSVar23);
            }
          }
        }
        paVar22 = &local_278.field_2;
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_190._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1f8._M_dataplus._M_p);
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8._M_dataplus._M_p);
        PrepareDescription(&local_258,this,&((*ppFVar17)->super_Definition).doc_comment);
        iVar4 = std::__cxx11::string::compare((char *)&local_258);
        if (iVar4 != 0) {
          bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
          pcVar24 = "";
          if (bVar25) {
            pcVar24 = "\n";
          }
          local_120 = &local_110;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,pcVar24,pcVar24 + bVar25);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x35eb60);
          local_168 = &local_158;
          puVar11 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar11) {
            local_158 = *puVar11;
            lStack_150 = plVar5[3];
          }
          else {
            local_158 = *puVar11;
            local_168 = (ulong *)*plVar5;
          }
          local_160 = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          local_148 = &local_138;
          std::__cxx11::string::_M_construct((ulong)&local_148,(char)(iVar4 << 3));
          uVar20 = 0xf;
          if (local_168 != &local_158) {
            uVar20 = local_158;
          }
          if (uVar20 < (ulong)(local_140 + local_160)) {
            uVar20 = 0xf;
            if (local_148 != &local_138) {
              uVar20 = local_138;
            }
            if (uVar20 < (ulong)(local_140 + local_160)) goto LAB_002d408a;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_168)
            ;
          }
          else {
LAB_002d408a:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_148);
          }
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar11 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_190.field_2._M_allocated_capacity = *puVar11;
            local_190.field_2._8_8_ = puVar6[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar11;
            local_190._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_190._M_string_length = puVar6[1];
          *puVar6 = puVar11;
          puVar6[1] = 0;
          *(undefined1 *)puVar11 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar11 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_238.field_2._M_allocated_capacity = *puVar11;
            local_238.field_2._8_8_ = plVar5[3];
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar11;
            local_238._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_238._M_string_length = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_238,(ulong)local_258._M_dataplus._M_p);
          puVar11 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_278.field_2._M_allocated_capacity = *puVar11;
            local_278.field_2._8_8_ = plVar5[3];
            local_278._M_dataplus._M_p = (pointer)paVar22;
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar11;
            local_278._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_278._M_string_length = plVar5[1];
          *plVar5 = (long)puVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_278._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar22) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
        }
        pcVar24 = "";
        bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (bVar25) {
          pcVar24 = "\n";
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,pcVar24,pcVar24 + bVar25);
        iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        local_168 = &local_158;
        std::__cxx11::string::_M_construct((ulong)&local_168,(char)iVar4 * '\a');
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          uVar21 = local_190.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_160 + local_190._M_string_length) {
          uVar20 = 0xf;
          if (local_168 != &local_158) {
            uVar20 = local_158;
          }
          if (uVar20 < local_160 + local_190._M_string_length) goto LAB_002d436b;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_168,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
        }
        else {
LAB_002d436b:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_168);
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        puVar11 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_238.field_2._M_allocated_capacity = *puVar11;
          local_238.field_2._8_8_ = puVar6[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar11;
          local_238._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_238._M_string_length = puVar6[1];
        *puVar6 = puVar11;
        puVar6[1] = 0;
        *(undefined1 *)puVar11 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_278.field_2._M_allocated_capacity = *psVar10;
          local_278.field_2._8_8_ = plVar5[3];
          local_278._M_dataplus._M_p = (pointer)paVar22;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar10;
          local_278._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_278._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_278._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if (local_168 != &local_158) {
          operator_delete(local_168,local_158 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if (*ppFVar17 !=
            (local_100->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1]) {
          std::__cxx11::string::append((char *)&local_1d8);
        }
        bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        pcVar24 = "";
        if (bVar25) {
          pcVar24 = "\n";
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,pcVar24,pcVar24 + bVar25);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_1d8);
        puVar11 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_278.field_2._M_allocated_capacity = *puVar11;
          local_278.field_2._8_8_ = puVar6[3];
          local_278._M_dataplus._M_p = (pointer)paVar22;
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar11;
          local_278._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_278._M_string_length = puVar6[1];
        *puVar6 = puVar11;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_278._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
      iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar4 * '\x03');
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
      puVar11 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = plVar5[3];
        local_278._M_dataplus._M_p = (pointer)paVar22;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar24,pcVar24 + bVar25)
      ;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        uVar21 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1f8._M_string_length + local_278._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar21 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1f8._M_string_length + local_278._M_string_length)
        goto LAB_002d47c2;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d47c2:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_278,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_1b8._M_dataplus._M_p = (pointer)0x0;
      local_1b8._M_string_length = 0;
      local_1b8.field_2._M_allocated_capacity = 0;
      std::
      copy_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,std::back_insert_iterator<std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,flatbuffers::jsons::JsonSchemaGenerator::generate()::_lambda(flatbuffers::FieldDef_const*)_1_>
                ((local_100->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (local_100->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_1b8);
      if (local_1b8._M_dataplus._M_p != (pointer)local_1b8._M_string_length) {
        iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        local_278._M_dataplus._M_p = (pointer)paVar22;
        std::__cxx11::string::_M_construct((ulong)&local_278,(char)iVar4 * '\x03');
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar10 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258.field_2._8_8_ = puVar6[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_258._M_string_length = puVar6[1];
        *puVar6 = psVar10;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        _Var15._M_p = local_1b8._M_dataplus._M_p;
        if (local_1b8._M_dataplus._M_p != (pointer)local_1b8._M_string_length) {
          do {
            std::operator+(&local_238,"\"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            _Var15._M_p);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
            puVar11 = (ulong *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_278.field_2._M_allocated_capacity = *puVar11;
              local_278.field_2._8_8_ = plVar5[3];
              local_278._M_dataplus._M_p = (pointer)paVar22;
            }
            else {
              local_278.field_2._M_allocated_capacity = *puVar11;
              local_278._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_278._M_string_length = plVar5[1];
            *plVar5 = (long)puVar11;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != paVar22) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            if (*(size_type *)_Var15._M_p != *(size_type *)(local_1b8._M_string_length + -8)) {
              std::__cxx11::string::append((char *)&local_258);
            }
            _Var15._M_p = _Var15._M_p + 8;
          } while (_Var15._M_p != (pointer)local_1b8._M_string_length);
        }
        std::__cxx11::string::append((char *)&local_258);
        bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
        pcVar24 = "";
        if (bVar25) {
          pcVar24 = "\n";
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,pcVar24,pcVar24 + bVar25);
        psVar14 = local_170;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_238,0,(char *)0x0,
                                    (ulong)local_258._M_dataplus._M_p);
        puVar11 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_278.field_2._M_allocated_capacity = *puVar11;
          local_278.field_2._8_8_ = plVar5[3];
          local_278._M_dataplus._M_p = (pointer)paVar22;
        }
        else {
          local_278.field_2._M_allocated_capacity = *puVar11;
          local_278._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_278._M_string_length = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_278._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != paVar22) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
      }
      iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar4 * '\x03');
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
      puVar11 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = plVar5[3];
        local_278._M_dataplus._M_p = (pointer)paVar22;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar24,pcVar24 + bVar25)
      ;
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        uVar21 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_1f8._M_string_length + local_278._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          uVar21 = local_1f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1f8._M_string_length + local_278._M_string_length)
        goto LAB_002d4c96;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_002d4c96:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_278,(ulong)local_1f8._M_dataplus._M_p);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      local_278._M_dataplus._M_p = (pointer)paVar22;
      std::__cxx11::string::_M_construct((ulong)&local_278,(char)iVar4 * '\x02');
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = puVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_258._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      pPVar8 = (this->super_BaseGenerator).parser_;
      if (*local_128 !=
          (pPVar8->structs_).vec.
          super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1]) {
        std::__cxx11::string::append((char *)&local_258);
        pPVar8 = (this->super_BaseGenerator).parser_;
      }
      bVar25 = -1 < (pPVar8->opts).indent_step;
      pcVar24 = "";
      if (bVar25) {
        pcVar24 = "\n";
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,pcVar24,pcVar24 + bVar25)
      ;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_238,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
      puVar11 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278.field_2._8_8_ = puVar6[3];
        local_278._M_dataplus._M_p = (pointer)paVar22;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar11;
        local_278._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_278._M_string_length = puVar6[1];
      *puVar6 = puVar11;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar22) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_1b8._M_dataplus._M_p,
                        local_1b8.field_2._M_allocated_capacity - (long)local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      local_128 = local_128 + 1;
      pPVar8 = (this->super_BaseGenerator).parser_;
    } while (local_128 !=
             (pPVar8->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar24 = "";
  iVar4 = (pPVar8->opts).indent_step;
  iVar18 = 0;
  if (0 < iVar4) {
    iVar18 = iVar4;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_238,(char)iVar18);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
  paVar22 = &local_278.field_2;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_278.field_2._M_allocated_capacity = *puVar11;
    local_278.field_2._8_8_ = plVar5[3];
    local_278._M_dataplus._M_p = (pointer)paVar22;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar11;
    local_278._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_278._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  pcVar19 = "";
  if (bVar25) {
    pcVar19 = "\n";
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar19,pcVar19 + bVar25);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar22) {
    uVar21 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_218._M_string_length + local_278._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar21 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_218._M_string_length + local_278._M_string_length) goto LAB_002d5080;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_218,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_002d5080:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258.field_2._8_8_ = puVar6[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_258._M_string_length = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  std::__cxx11::string::_M_append((char *)local_170,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar22) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (((this->super_BaseGenerator).parser_)->opts).indent_step;
  iVar18 = 0;
  if (0 < iVar4) {
    iVar18 = iVar4;
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)iVar18);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_218.field_2._M_allocated_capacity = *puVar11;
    local_218.field_2._8_8_ = plVar5[3];
  }
  else {
    local_218.field_2._M_allocated_capacity = *puVar11;
    local_218._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_218._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  anon_unknown_1::GenFullName<flatbuffers::StructDef>
            (&local_1b8,((this->super_BaseGenerator).parser_)->root_struct_def_);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    uVar21 = local_218.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_1b8._M_string_length + local_218._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      uVar21 = local_1b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_1b8._M_string_length + local_218._M_string_length) goto LAB_002d525a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
  }
  else {
LAB_002d525a:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1b8._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_238.field_2._M_allocated_capacity = *psVar10;
    local_238.field_2._8_8_ = puVar6[3];
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar10;
    local_238._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_238._M_string_length = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_238);
  psVar14 = local_170;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_278.field_2._M_allocated_capacity = *puVar11;
    local_278.field_2._8_8_ = plVar5[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar11;
    local_278._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_278._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  pcVar19 = "";
  if (bVar25) {
    pcVar19 = "\n";
  }
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar19,pcVar19 + bVar25);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    uVar21 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_1d0 + local_278._M_string_length) {
    uVar20 = 0xf;
    if (local_1d8 != &local_1c8) {
      uVar20 = local_1c8;
    }
    if (uVar20 < local_1d0 + local_278._M_string_length) goto LAB_002d539f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_002d539f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1d8);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258.field_2._8_8_ = puVar6[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_258._M_string_length = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  std::__cxx11::string::_M_append((char *)psVar14,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  paVar22 = &local_278.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar22) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  bVar25 = -1 < (((this->super_BaseGenerator).parser_)->opts).indent_step;
  if (bVar25) {
    pcVar24 = "\n";
  }
  local_278._M_dataplus._M_p = (pointer)paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,pcVar24,pcVar24 + bVar25);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x36f4b3);
  pSVar23 = local_38;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258.field_2._8_8_ = plVar5[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_258._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_170,(ulong)local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar22) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
LAB_002d55b1:
  return pSVar23 != (StructDef *)0x0;
}

Assistant:

bool generate() {
    code_ = "";
    if (parser_.root_struct_def_ == nullptr) {
      std::cerr << "Error: Binary schema not generated, no root struct found\n";
      return false;
    }
    code_ += "{" + NewLine();
    code_ += Indent(1) +
             "\"$schema\": \"https://json-schema.org/draft/2019-09/schema\"," +
             NewLine();
    code_ += Indent(1) + "\"definitions\": {" + NewLine();
    for (auto e = parser_.enums_.vec.cbegin(); e != parser_.enums_.vec.cend();
         ++e) {
      code_ += Indent(2) + "\"" + GenFullName(*e) + "\" : {" + NewLine();
      code_ += Indent(3) + GenType("string") + "," + NewLine();
      auto enumdef(Indent(3) + "\"enum\": [");
      for (auto enum_value = (*e)->Vals().begin();
           enum_value != (*e)->Vals().end(); ++enum_value) {
        enumdef.append("\"" + (*enum_value)->name + "\"");
        if (*enum_value != (*e)->Vals().back()) { enumdef.append(", "); }
      }
      enumdef.append("]");
      code_ += enumdef + NewLine();
      code_ += Indent(2) + "}," + NewLine();  // close type
    }
    for (auto s = parser_.structs_.vec.cbegin();
         s != parser_.structs_.vec.cend(); ++s) {
      const auto &structure = *s;
      code_ += Indent(2) + "\"" + GenFullName(structure) + "\" : {" + NewLine();
      code_ += Indent(3) + GenType("object") + "," + NewLine();
      const auto &comment_lines = structure->doc_comment;
      auto comment = PrepareDescription(comment_lines);
      if (comment != "") {
        code_ += Indent(3) + "\"description\" : " + comment + "," + NewLine();
      }

      code_ += Indent(3) + "\"properties\" : {" + NewLine();

      const auto &properties = structure->fields.vec;
      for (auto prop = properties.cbegin(); prop != properties.cend(); ++prop) {
        const auto &property = *prop;
        std::string arrayInfo = "";
        if (IsArray(property->value.type)) {
          arrayInfo = "," + NewLine() + Indent(8) + "\"minItems\": " +
                      NumToString(property->value.type.fixed_length) + "," +
                      NewLine() + Indent(8) + "\"maxItems\": " +
                      NumToString(property->value.type.fixed_length);
        }
        std::string deprecated_info = "";
        if (property->deprecated) {
          deprecated_info =
              "," + NewLine() + Indent(8) + "\"deprecated\" : true";
        }
        std::string typeLine = Indent(4) + "\"" + property->name + "\"";
        typeLine += " : {" + NewLine() + Indent(8);
        typeLine += GenType(property->value.type);
        typeLine += arrayInfo;
        typeLine += deprecated_info;
        auto description = PrepareDescription(property->doc_comment);
        if (description != "") {
          typeLine +=
              "," + NewLine() + Indent(8) + "\"description\" : " + description;
        }

        typeLine += NewLine() + Indent(7) + "}";
        if (property != properties.back()) { typeLine.append(","); }
        code_ += typeLine + NewLine();
      }
      code_ += Indent(3) + "}," + NewLine();  // close properties

      std::vector<FieldDef *> requiredProperties;
      std::copy_if(properties.begin(), properties.end(),
                   back_inserter(requiredProperties),
                   [](FieldDef const *prop) { return prop->IsRequired(); });
      if (!requiredProperties.empty()) {
        auto required_string(Indent(3) + "\"required\" : [");
        for (auto req_prop = requiredProperties.cbegin();
             req_prop != requiredProperties.cend(); ++req_prop) {
          required_string.append("\"" + (*req_prop)->name + "\"");
          if (*req_prop != requiredProperties.back()) {
            required_string.append(", ");
          }
        }
        required_string.append("],");
        code_ += required_string + NewLine();
      }
      code_ += Indent(3) + "\"additionalProperties\" : false" + NewLine();
      auto closeType(Indent(2) + "}");
      if (*s != parser_.structs_.vec.back()) { closeType.append(","); }
      code_ += closeType + NewLine();  // close type
    }
    code_ += Indent(1) + "}," + NewLine();  // close definitions

    // mark root type
    code_ += Indent(1) + "\"$ref\" : \"#/definitions/" +
             GenFullName(parser_.root_struct_def_) + "\"" + NewLine();

    code_ += "}" + NewLine();  // close schema root
    return true;
  }